

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O1

void __thiscall DListMenu::Init(DListMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FListMenuDescriptor *pFVar4;
  int iVar5;
  ulong uVar6;
  
  (this->super_DMenu).mParentMenu.field_0.p = parent;
  if (((parent != (DMenu *)0x0) && (((parent->super_DObject).ObjectFlags & 3) != 0)) &&
     (((this->super_DMenu).super_DObject.ObjectFlags & 4) != 0)) {
    GC::Barrier((DObject *)this,&parent->super_DObject);
  }
  this->mDesc = desc;
  if (desc->mCenter == true) {
    pFVar4 = this->mDesc;
    if ((pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count == 0) {
      iVar5 = 0xa0;
    }
    else {
      iVar5 = 0xa0;
      uVar6 = 0;
      do {
        iVar2 = (*(pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar6]->
                  _vptr_FListMenuItem[0x10])();
        if (0 < iVar2) {
          iVar1 = this->mDesc->mSelectOfsX;
          iVar3 = (*(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array
                    [uVar6]->_vptr_FListMenuItem[5])();
          if (((char)iVar3 != '\0') && (iVar2 = 0xa0 - ((iVar2 - iVar1) / 2 + iVar1), iVar2 < iVar5)
             ) {
            iVar5 = iVar2;
          }
        }
        uVar6 = uVar6 + 1;
        pFVar4 = this->mDesc;
      } while (uVar6 < (pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count);
    }
    pFVar4 = this->mDesc;
    if ((pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count != 0) {
      uVar6 = 0;
      do {
        iVar2 = (*(pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar6]->
                  _vptr_FListMenuItem[0x10])();
        if (0 < iVar2) {
          (this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar6]->mXpos =
               iVar5;
        }
        uVar6 = uVar6 + 1;
        pFVar4 = this->mDesc;
      } while (uVar6 < (pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count);
    }
  }
  return;
}

Assistant:

void DListMenu::Init(DMenu *parent, FListMenuDescriptor *desc)
{
	mParentMenu = parent;
	GC::WriteBarrier(this, parent);
	mDesc = desc;
	if (desc->mCenter)
	{
		int center = 160;
		for(unsigned i=0;i<mDesc->mItems.Size(); i++)
		{
			int xpos = mDesc->mItems[i]->GetX();
			int width = mDesc->mItems[i]->GetWidth();
			int curx = mDesc->mSelectOfsX;

			if (width > 0 && mDesc->mItems[i]->Selectable())
			{
				int left = 160 - (width - curx) / 2 - curx;
				if (left < center) center = left;
			}
		}
		for(unsigned i=0;i<mDesc->mItems.Size(); i++)
		{
			int width = mDesc->mItems[i]->GetWidth();

			if (width > 0)
			{
				mDesc->mItems[i]->SetX(center);
			}
		}
	}
}